

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O0

void __thiscall TPZCompElDisc::Print(TPZCompElDisc *this,ostream *out)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  int64_t iVar3;
  void *pvVar4;
  TPZManVector<double,_3> *pTVar5;
  ostream *poVar6;
  TPZVec<double> *v;
  double *pdVar7;
  ostream *in_RSI;
  long *in_RDI;
  TPZManVector<double,_3> loccenter;
  TPZManVector<double,_3> xcenter;
  TPZGeoEl *Ref;
  int i;
  int size;
  TPZCompEl *in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff28;
  TPZManVector<double,_3> *in_stack_ffffffffffffff30;
  TPZManVector<double,_3> *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff50;
  undefined1 local_90 [56];
  ostream *in_stack_ffffffffffffffa8;
  TPZCompEl *in_stack_ffffffffffffffb0;
  int local_18;
  
  std::operator<<(in_RSI,"\nDiscontinous element : \n");
  TPZCompEl::Print(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pTVar2 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
  if (pTVar2 != (TPZGeoEl *)0x0) {
    in_stack_ffffffffffffff50 = std::operator<<(in_RSI,"\tGeometric reference index : ");
    pTVar2 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
    iVar3 = TPZGeoEl::Index(pTVar2);
    pvVar4 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff50,iVar3);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  pTVar5 = (TPZManVector<double,_3> *)std::operator<<(in_RSI,"\tMaterial id : ");
  pTVar2 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
  iVar1 = TPZGeoEl::MaterialId(pTVar2);
  pvVar4 = (void *)std::ostream::operator<<(pTVar5,iVar1);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  v = (TPZVec<double> *)std::operator<<(poVar6,"\tDegree of interpolation : ");
  iVar1 = (**(code **)(*in_RDI + 0x338))();
  pvVar4 = (void *)std::ostream::operator<<(v,iVar1);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"\tConnect index : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar6,in_RDI[8]);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"\tUsing qsieta : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar6,(uint)(*(byte *)(in_RDI + 10) & 1));
  poVar6 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,"\tNormalizing constant : ");
  pvVar4 = (void *)std::ostream::operator<<(poVar6,(double)in_RDI[9]);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"\tCenter point of the element : ");
  if ((*(byte *)(in_RDI + 10) & 1) == 0) {
    iVar3 = TPZVec<double>::NElements((TPZVec<double> *)(in_RDI + 0xc));
    for (local_18 = 0; local_18 < (int)iVar3 + -1; local_18 = local_18 + 1) {
      poVar6 = in_RSI;
      pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xc),(long)local_18);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pdVar7);
      std::operator<<(poVar6," , ");
    }
    poVar6 = std::operator<<(in_RSI,"stored xy : ");
    pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0xc),(long)local_18);
    pvVar4 = (void *)std::ostream::operator<<(poVar6,*pdVar7);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    pTVar2 = TPZCompEl::Reference(in_stack_ffffffffffffff18);
    if (pTVar2 != (TPZGeoEl *)0x0) {
      TPZManVector<double,_3>::TPZManVector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      TPZManVector<double,_3>::TPZManVector(pTVar5,in_stack_ffffffffffffff38);
      (**(code **)(*(long *)pTVar2 + 0x228))(pTVar2,local_90,&stack0xffffffffffffffa8);
      std::operator<<(in_RSI,"stored qsieta ");
      poVar6 = ::operator<<(in_stack_ffffffffffffff50,v);
      std::operator<<(poVar6," computed xy ");
      pTVar5 = (TPZManVector<double,_3> *)::operator<<(in_stack_ffffffffffffff50,v);
      std::ostream::operator<<(pTVar5,std::endl<char,std::char_traits<char>>);
      TPZManVector<double,_3>::~TPZManVector(pTVar5);
      TPZManVector<double,_3>::~TPZManVector(pTVar5);
    }
  }
  poVar6 = std::operator<<(in_RSI,"\tDimension : ");
  iVar1 = (**(code **)(*in_RDI + 0xb0))();
  pvVar4 = (void *)std::ostream::operator<<(poVar6,iVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZCompElDisc::Print(std::ostream &out) const{
	
	out << "\nDiscontinous element : \n";
	TPZCompEl::Print(out);
	if(Reference()) out << "\tGeometric reference index : " << Reference()->Index() << endl;
	out << "\tMaterial id : " << Reference()->MaterialId() << endl
	<< "\tDegree of interpolation : " <<  this->Degree() << endl
	<< "\tConnect index : " << fConnectIndex << endl
    << "\tUsing qsieta : " << (int)fUseQsiEta << endl
	<< "\tNormalizing constant : " << fConstC << endl
	<< "\tCenter point of the element : ";
    if(fUseQsiEta == false)
    {
        int size = fCenterPoint.NElements(),i;
        for(i=0;i<size-1;i++) out << fCenterPoint[i] << " , ";
        out << "stored xy : " << fCenterPoint[i] << endl;
    }
    else
    {
        TPZGeoEl *Ref = Reference();
        if (Ref) {
            TPZManVector<REAL,3> xcenter(3),loccenter(fCenterPoint);
            Ref->X(loccenter, xcenter);
            out << "stored qsieta " << fCenterPoint << " computed xy " << xcenter << std::endl;
        }
    }
	out << "\tDimension : " << this->Dimension() << endl;
}